

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::FormatCxxExceptionMessage_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *description,char *location)

{
  Message *pMVar1;
  Message local_28;
  Message message;
  char *location_local;
  char *description_local;
  
  message.ss_.ptr_ =
       (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )description;
  location_local = (char *)this;
  description_local = (char *)__return_storage_ptr__;
  Message::Message(&local_28);
  if (location_local == (char *)0x0) {
    Message::operator<<(&local_28,(char (*) [22])"Unknown C++ exception");
  }
  else {
    pMVar1 = Message::operator<<(&local_28,(char (*) [33])"C++ exception with description \"");
    pMVar1 = Message::operator<<(pMVar1,&location_local);
    Message::operator<<(pMVar1,(char (*) [2])0x1dd307);
  }
  pMVar1 = Message::operator<<(&local_28,(char (*) [12])" thrown in ");
  pMVar1 = Message::operator<<(pMVar1,(char **)&message);
  Message::operator<<(pMVar1,(char (*) [2])0x1dd13f);
  Message::GetString_abi_cxx11_(__return_storage_ptr__,&local_28);
  Message::~Message(&local_28);
  return __return_storage_ptr__;
}

Assistant:

static std::string FormatCxxExceptionMessage(const char* description,
                                             const char* location) {
  Message message;
  if (description != NULL) {
    message << "C++ exception with description \"" << description << "\"";
  } else {
    message << "Unknown C++ exception";
  }
  message << " thrown in " << location << ".";

  return message.GetString();
}